

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcbordiagnostic.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_a196ab::DiagnosticNotation::~DiagnosticNotation(DiagnosticNotation *this)

{
  Data *pDVar1;
  Data *pDVar2;
  
  pDVar1 = (this->result).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->result).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar1 = (this->separator).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->separator).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar2 = (this->byteArrayFormatStack).super_QList<int>.d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value =
         (Type)((int)(pDVar2->super_QArrayData).ref_._q_value + -1);
    UNLOCK();
    if ((__atomic_base<int>)*(__int_type_conflict *)&(pDVar2->super_QArrayData).ref_._q_value ==
        (__atomic_base<int>)0x0) {
      QArrayData::deallocate
                (&((this->byteArrayFormatStack).super_QList<int>.d.d)->super_QArrayData,4,0x10);
      return;
    }
  }
  return;
}

Assistant:

static QString create(const QCborValue &v, QCborValue::DiagnosticNotationOptions opts)
    {
        DiagnosticNotation dn(opts);
        dn.appendValue(v);
        return dn.result;
    }